

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Souperify.cpp
# Opt level: O1

void __thiscall wasm::DataFlow::Printer::warnOnSuspiciousValues(Printer *this,Node *node)

{
  pointer ppNVar1;
  Node *pNVar2;
  Function *pFVar3;
  int iVar4;
  Node *pNVar5;
  ostream *poVar6;
  char *in_RCX;
  long lVar7;
  char *pcVar8;
  pointer ppNVar9;
  bool bVar10;
  Name name;
  
  iVar4 = debug();
  if (iVar4 == 0) {
    __assert_fail("debug()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Souperify.cpp"
                  ,0x2a5,"void wasm::DataFlow::Printer::warnOnSuspiciousValues(Node *)");
  }
  ppNVar9 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (node->values).
            super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  bVar10 = ppNVar9 == ppNVar1;
  if (!bVar10) {
    pNVar2 = *ppNVar9;
    pNVar5 = getMaybeReplaced(this,pNVar2);
    if (pNVar2 == pNVar5) {
      do {
        ppNVar9 = ppNVar9 + 1;
        bVar10 = ppNVar9 == ppNVar1;
        if (bVar10) goto LAB_00b50202;
        pNVar2 = *ppNVar9;
        pNVar5 = getMaybeReplaced(this,pNVar2);
      } while (pNVar2 == pNVar5);
    }
    if (!bVar10) {
      return;
    }
  }
LAB_00b50202:
  bVar10 = allInputsIdentical(node);
  if (bVar10) {
    pcVar8 = "^^ suspicious identical inputs! missing optimization in ";
    lVar7 = 0x38;
  }
  else {
    if ((node->type == Phi) || (bVar10 = allInputsConstant(node), !bVar10)) {
      return;
    }
    pcVar8 = "^^ suspicious constant inputs! missing optimization in ";
    lVar7 = 0x37;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
  pFVar3 = this->graph->func;
  name.super_IString.str._M_str = in_RCX;
  name.super_IString.str._M_len =
       (size_t)(pFVar3->super_Importable).super_Named.name.super_IString.str._M_str;
  poVar6 = wasm::operator<<((wasm *)&std::cout,
                            (ostream *)
                            (pFVar3->super_Importable).super_Named.name.super_IString.str._M_len,
                            name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"? ^^\n",5);
  return;
}

Assistant:

void warnOnSuspiciousValues(Node* node) {
    assert(debug());
    // If the node has no uses, it's not interesting enough to be
    // suspicious. TODO
    // If an input was replaced with a var, then we should not
    // look into it, it's not suspiciously trivial.
    for (auto* value : node->values) {
      if (value != getMaybeReplaced(value)) {
        return;
      }
    }
    if (allInputsIdentical(node)) {
      std::cout << "^^ suspicious identical inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
    if (!node->isPhi() && allInputsConstant(node)) {
      std::cout << "^^ suspicious constant inputs! missing optimization in "
                << graph.func->name << "? ^^\n";
      return;
    }
  }